

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixin_inheritance.cpp
# Opt level: O0

string * to_string_abi_cxx11_(string *__return_storage_ptr__,Color *c)

{
  Color CVar1;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  Color *local_18;
  Color *c_local;
  
  CVar1 = *c;
  local_18 = c;
  c_local = (Color *)__return_storage_ptr__;
  if (CVar1 == Red) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"red",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else if (CVar1 == Green) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"green",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  else if (CVar1 == Blue) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"blue",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"none",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Color& c)
{
	switch(c)
	{
	case Color::Red:
		return "red";
	case Color::Blue:
		return "blue";
	case Color::Green:
		return "green";
	default:
		return "none";
	}
}